

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_257,_false,_embree::avx2::VirtualCurveIntersectorK<8>,_true>::
     occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  BVH *bvh;
  NodeRef root;
  ulong uVar1;
  size_t k;
  RayQueryContext *pRVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  char cVar12;
  int iVar13;
  undefined8 *puVar14;
  uint uVar15;
  undefined4 uVar16;
  ulong uVar17;
  ulong uVar18;
  RayQueryContext *pRVar19;
  uint uVar20;
  long lVar21;
  ulong *puVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [32];
  bool bVar25;
  float fVar26;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  float fVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 in_ZMM1 [64];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar56 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 in_ZMM5 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  vfloat4 a0;
  undefined1 auVar71 [16];
  undefined1 auVar74 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar75 [64];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  vbool<8> terminated;
  vbool<8> valid_o;
  TravRayK<8,_false> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  undefined1 local_5ca0 [32];
  undefined1 local_5c80 [32];
  undefined8 local_5c60;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5c40;
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [8];
  float fStack_5b98;
  float fStack_5b94;
  float fStack_5b90;
  float fStack_5b8c;
  float fStack_5b88;
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  float local_5b20;
  float fStack_5b1c;
  float fStack_5b18;
  float fStack_5b14;
  float fStack_5b10;
  float fStack_5b0c;
  float fStack_5b08;
  undefined4 uStack_5b04;
  float local_5b00;
  float fStack_5afc;
  float fStack_5af8;
  float fStack_5af4;
  float fStack_5af0;
  float fStack_5aec;
  float fStack_5ae8;
  undefined4 uStack_5ae4;
  float local_5ae0;
  float fStack_5adc;
  float fStack_5ad8;
  float fStack_5ad4;
  float fStack_5ad0;
  float fStack_5acc;
  float fStack_5ac8;
  undefined4 uStack_5ac4;
  undefined1 local_5ac0 [32];
  undefined1 local_5aa0 [32];
  undefined1 local_5a80 [32];
  undefined1 local_5a60 [32];
  undefined1 local_5a40 [32];
  undefined1 local_5a20 [32];
  undefined1 local_5a00 [32];
  undefined1 local_59e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_59c0;
  undefined1 local_59a0 [16];
  undefined1 auStack_5990 [16];
  undefined1 auStack_5980 [368];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar48 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    auVar46 = *(undefined1 (*) [32])(ray + 0x100);
    auVar41 = vpcmpeqd_avx2(auVar48,(undefined1  [32])valid_i->field_0);
    auVar48 = vcmpps_avx(auVar46,ZEXT1632(ZEXT816(0) << 0x40),5);
    auVar48 = vandps_avx(auVar48,auVar41);
    uVar15 = vmovmskps_avx(auVar48);
    if (uVar15 != 0) {
      auVar51 = vpackssdw_avx(auVar48._0_16_,auVar48._16_16_);
      local_5be0 = *(undefined1 (*) [32])(ray + 0x80);
      local_5bc0 = *(undefined1 (*) [32])(ray + 0xa0);
      _local_5ba0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar75._0_4_ = local_5ba0._0_4_ * local_5ba0._0_4_;
      auVar75._4_4_ = local_5ba0._4_4_ * local_5ba0._4_4_;
      auVar75._8_4_ = local_5ba0._8_4_ * local_5ba0._8_4_;
      auVar75._12_4_ = local_5ba0._12_4_ * local_5ba0._12_4_;
      auVar75._16_4_ = local_5ba0._16_4_ * local_5ba0._16_4_;
      auVar75._20_4_ = local_5ba0._20_4_ * local_5ba0._20_4_;
      auVar75._28_36_ = in_ZMM5._28_36_;
      auVar75._24_4_ = local_5ba0._24_4_ * local_5ba0._24_4_;
      auVar61 = vfmadd231ps_fma(auVar75._0_32_,local_5bc0,local_5bc0);
      auVar61 = vfmadd231ps_fma(ZEXT1632(auVar61),local_5be0,local_5be0);
      auVar48 = vrsqrtps_avx(ZEXT1632(auVar61));
      uVar17 = (ulong)(uVar15 & 0xff);
      fVar26 = auVar48._0_4_;
      fVar30 = auVar48._4_4_;
      fVar31 = auVar48._8_4_;
      fVar32 = auVar48._12_4_;
      fVar33 = auVar48._16_4_;
      fVar38 = auVar48._20_4_;
      fVar39 = auVar48._24_4_;
      auVar41._4_4_ = fVar30 * fVar30 * fVar30 * auVar61._4_4_ * -0.5;
      auVar41._0_4_ = fVar26 * fVar26 * fVar26 * auVar61._0_4_ * -0.5;
      auVar41._8_4_ = fVar31 * fVar31 * fVar31 * auVar61._8_4_ * -0.5;
      auVar41._12_4_ = fVar32 * fVar32 * fVar32 * auVar61._12_4_ * -0.5;
      auVar41._16_4_ = fVar33 * fVar33 * fVar33 * -0.0;
      auVar41._20_4_ = fVar38 * fVar38 * fVar38 * -0.0;
      auVar41._24_4_ = fVar39 * fVar39 * fVar39 * -0.0;
      auVar41._28_4_ = 0;
      auVar65._8_4_ = 0x3fc00000;
      auVar65._0_8_ = 0x3fc000003fc00000;
      auVar65._12_4_ = 0x3fc00000;
      auVar65._16_4_ = 0x3fc00000;
      auVar65._20_4_ = 0x3fc00000;
      auVar65._24_4_ = 0x3fc00000;
      auVar65._28_4_ = 0x3fc00000;
      auVar61 = vfmadd213ps_fma(auVar65,auVar48,auVar41);
      local_59c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)ZEXT1632(auVar61);
      auVar55._8_4_ = 0x80000000;
      auVar55._0_8_ = 0x8000000080000000;
      auVar55._12_4_ = 0x80000000;
      auVar61._12_4_ = 0;
      auVar61._0_12_ = ZEXT812(0);
      auVar61 = auVar61 << 0x20;
      do {
        lVar21 = 0;
        for (uVar23 = uVar17; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
          lVar21 = lVar21 + 1;
        }
        uVar23 = (ulong)(uint)((int)lVar21 * 4);
        auVar69 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar23 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar23 + 0xa0)),0x1c);
        auVar69 = vinsertps_avx(auVar69,ZEXT416(*(uint *)(ray + uVar23 + 0xc0)),0x28);
        fVar26 = *(float *)((long)&local_59c0 + uVar23);
        auVar71._0_4_ = auVar69._0_4_ * fVar26;
        auVar71._4_4_ = auVar69._4_4_ * fVar26;
        auVar71._8_4_ = auVar69._8_4_ * fVar26;
        auVar71._12_4_ = auVar69._12_4_ * fVar26;
        auVar79 = vshufpd_avx(auVar71,auVar71,1);
        auVar69 = vmovshdup_avx(auVar71);
        auVar77 = vunpckhps_avx(auVar71,auVar61);
        auVar76._0_8_ = auVar79._0_8_ ^ 0x8000000080000000;
        auVar76._8_8_ = auVar79._8_8_ ^ auVar55._8_8_;
        auVar76 = vinsertps_avx(auVar76,auVar71,0x2a);
        auVar77 = vshufps_avx(auVar77,ZEXT416(auVar69._0_4_ ^ 0x80000000),0x41);
        auVar69 = vdpps_avx(auVar76,auVar76,0x7f);
        auVar79 = vdpps_avx(auVar77,auVar77,0x7f);
        auVar69 = vcmpps_avx(auVar69,auVar79,1);
        auVar80._0_4_ = auVar69._0_4_;
        auVar80._4_4_ = auVar80._0_4_;
        auVar80._8_4_ = auVar80._0_4_;
        auVar80._12_4_ = auVar80._0_4_;
        auVar69 = vblendvps_avx(auVar76,auVar77,auVar80);
        auVar79 = vdpps_avx(auVar69,auVar69,0x7f);
        auVar76 = vrsqrtss_avx(auVar79,auVar79);
        fVar30 = auVar76._0_4_;
        fVar30 = fVar30 * 1.5 - auVar79._0_4_ * 0.5 * fVar30 * fVar30 * fVar30;
        auVar77._0_4_ = auVar69._0_4_ * fVar30;
        auVar77._4_4_ = auVar69._4_4_ * fVar30;
        auVar77._8_4_ = auVar69._8_4_ * fVar30;
        auVar77._12_4_ = auVar69._12_4_ * fVar30;
        auVar69 = vshufps_avx(auVar77,auVar77,0xc9);
        auVar79 = vshufps_avx(auVar71,auVar71,0xc9);
        auVar81._0_4_ = auVar77._0_4_ * auVar79._0_4_;
        auVar81._4_4_ = auVar77._4_4_ * auVar79._4_4_;
        auVar81._8_4_ = auVar77._8_4_ * auVar79._8_4_;
        auVar81._12_4_ = auVar77._12_4_ * auVar79._12_4_;
        auVar69 = vfmsub231ps_fma(auVar81,auVar71,auVar69);
        auVar76 = vshufps_avx(auVar69,auVar69,0xc9);
        auVar69 = vdpps_avx(auVar76,auVar76,0x7f);
        lVar21 = lVar21 * 0x30;
        auVar79 = vrsqrtss_avx(auVar69,auVar69);
        fVar30 = auVar79._0_4_;
        fVar30 = fVar30 * 1.5 - auVar69._0_4_ * 0.5 * fVar30 * fVar30 * fVar30;
        uVar17 = uVar17 - 1 & uVar17;
        auVar79._0_4_ = fVar30 * auVar76._0_4_;
        auVar79._4_4_ = fVar30 * auVar76._4_4_;
        auVar79._8_4_ = fVar30 * auVar76._8_4_;
        auVar79._12_4_ = fVar30 * auVar76._12_4_;
        auVar69._0_4_ = fVar26 * auVar71._0_4_;
        auVar69._4_4_ = fVar26 * auVar71._4_4_;
        auVar69._8_4_ = fVar26 * auVar71._8_4_;
        auVar69._12_4_ = fVar26 * auVar71._12_4_;
        auVar76 = vunpcklps_avx(auVar77,auVar69);
        auVar69 = vunpckhps_avx(auVar77,auVar69);
        auVar77 = vunpcklps_avx(auVar79,auVar61);
        auVar79 = vunpckhps_avx(auVar79,auVar61);
        auVar79 = vunpcklps_avx(auVar69,auVar79);
        auVar71 = vunpcklps_avx(auVar76,auVar77);
        auVar69 = vunpckhps_avx(auVar76,auVar77);
        *(undefined1 (*) [16])(local_59a0 + lVar21) = auVar71;
        *(undefined1 (*) [16])(auStack_5990 + lVar21) = auVar69;
        *(undefined1 (*) [16])(auStack_5980 + lVar21) = auVar79;
      } while (uVar17 != 0);
      local_5c40._0_4_ = *(undefined4 *)ray;
      local_5c40._4_4_ = *(undefined4 *)(ray + 4);
      local_5c40._8_4_ = *(undefined4 *)(ray + 8);
      local_5c40._12_4_ = *(undefined4 *)(ray + 0xc);
      local_5c40._16_4_ = *(undefined4 *)(ray + 0x10);
      local_5c40._20_4_ = *(undefined4 *)(ray + 0x14);
      local_5c40._24_4_ = *(undefined4 *)(ray + 0x18);
      local_5c40._28_4_ = *(undefined4 *)(ray + 0x1c);
      local_5c40._32_4_ = *(undefined4 *)(ray + 0x20);
      local_5c40._36_4_ = *(undefined4 *)(ray + 0x24);
      local_5c40._40_4_ = *(undefined4 *)(ray + 0x28);
      local_5c40._44_4_ = *(undefined4 *)(ray + 0x2c);
      local_5c40._48_4_ = *(undefined4 *)(ray + 0x30);
      local_5c40._52_4_ = *(undefined4 *)(ray + 0x34);
      local_5c40._56_4_ = *(undefined4 *)(ray + 0x38);
      local_5c40._60_4_ = *(undefined4 *)(ray + 0x3c);
      local_5c40.field_0.z.field_0 = (vfloat_impl<8>)*(undefined1 (*) [32])(ray + 0x40);
      local_59e0._8_4_ = 0x7fffffff;
      local_59e0._0_8_ = 0x7fffffff7fffffff;
      local_59e0._12_4_ = 0x7fffffff;
      local_59e0._16_4_ = 0x7fffffff;
      local_59e0._20_4_ = 0x7fffffff;
      local_59e0._24_4_ = 0x7fffffff;
      local_59e0._28_4_ = 0x7fffffff;
      auVar48 = vandps_avx(local_59e0,local_5be0);
      auVar72._8_4_ = 0x219392ef;
      auVar72._0_8_ = 0x219392ef219392ef;
      auVar72._12_4_ = 0x219392ef;
      auVar72._16_4_ = 0x219392ef;
      auVar72._20_4_ = 0x219392ef;
      auVar72._24_4_ = 0x219392ef;
      auVar72._28_4_ = 0x219392ef;
      auVar48 = vcmpps_avx(auVar48,auVar72,1);
      auVar41 = vblendvps_avx(local_5be0,auVar72,auVar48);
      auVar48 = vandps_avx(local_59e0,local_5bc0);
      auVar48 = vcmpps_avx(auVar48,auVar72,1);
      auVar65 = vblendvps_avx(local_5bc0,auVar72,auVar48);
      auVar48 = vandps_avx(local_59e0,_local_5ba0);
      auVar48 = vcmpps_avx(auVar48,auVar72,1);
      auVar52 = vrcpps_avx(auVar41);
      auVar48 = vblendvps_avx(_local_5ba0,auVar72,auVar48);
      auVar73._8_4_ = 0x3f800000;
      auVar73._0_8_ = &DAT_3f8000003f800000;
      auVar73._12_4_ = 0x3f800000;
      auVar73._16_4_ = 0x3f800000;
      auVar73._20_4_ = 0x3f800000;
      auVar73._24_4_ = 0x3f800000;
      auVar73._28_4_ = 0x3f800000;
      auVar57 = vrcpps_avx(auVar65);
      auVar61 = vfnmadd213ps_fma(auVar41,auVar52,auVar73);
      auVar61 = vfmadd132ps_fma(ZEXT1632(auVar61),auVar52,auVar52);
      auVar55 = vfnmadd213ps_fma(auVar65,auVar57,auVar73);
      auVar55 = vfmadd132ps_fma(ZEXT1632(auVar55),auVar57,auVar57);
      auVar41 = vrcpps_avx(auVar48);
      auVar69 = vfnmadd213ps_fma(auVar48,auVar41,auVar73);
      auVar69 = vfmadd132ps_fma(ZEXT1632(auVar69),auVar41,auVar41);
      local_5b80 = ZEXT1632(auVar61);
      local_5b60 = ZEXT1632(auVar55);
      local_5b40 = ZEXT1632(auVar69);
      local_5b20 = auVar61._0_4_ * (float)local_5c40._0_4_;
      fStack_5b1c = auVar61._4_4_ * (float)local_5c40._4_4_;
      fStack_5b18 = auVar61._8_4_ * (float)local_5c40._8_4_;
      fStack_5b14 = auVar61._12_4_ * (float)local_5c40._12_4_;
      fStack_5b10 = (float)local_5c40._16_4_ * 0.0;
      fStack_5b0c = (float)local_5c40._20_4_ * 0.0;
      uStack_5b04 = auVar41._28_4_;
      fStack_5b08 = (float)local_5c40._24_4_ * 0.0;
      local_5b00 = (float)local_5c40._32_4_ * auVar55._0_4_;
      fStack_5afc = (float)local_5c40._36_4_ * auVar55._4_4_;
      fStack_5af8 = (float)local_5c40._40_4_ * auVar55._8_4_;
      fStack_5af4 = (float)local_5c40._44_4_ * auVar55._12_4_;
      fStack_5af0 = (float)local_5c40._48_4_ * 0.0;
      fStack_5aec = (float)local_5c40._52_4_ * 0.0;
      fStack_5ae8 = (float)local_5c40._56_4_ * 0.0;
      local_5ae0 = local_5c40._64_4_ * auVar69._0_4_;
      fStack_5adc = local_5c40._68_4_ * auVar69._4_4_;
      fStack_5ad8 = local_5c40._72_4_ * auVar69._8_4_;
      fStack_5ad4 = local_5c40._76_4_ * auVar69._12_4_;
      fStack_5ad0 = local_5c40._80_4_ * 0.0;
      fStack_5acc = local_5c40._84_4_ * 0.0;
      fStack_5ac8 = local_5c40._88_4_ * 0.0;
      auVar41 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar48 = vcmpps_avx(local_5b80,auVar41,1);
      auVar62._8_4_ = 0x20;
      auVar62._0_8_ = 0x2000000020;
      auVar62._12_4_ = 0x20;
      auVar62._16_4_ = 0x20;
      auVar62._20_4_ = 0x20;
      auVar62._24_4_ = 0x20;
      auVar62._28_4_ = 0x20;
      local_5ac0 = vandps_avx(auVar48,auVar62);
      auVar57._8_4_ = 0x40;
      auVar57._0_8_ = 0x4000000040;
      auVar57._12_4_ = 0x40;
      auVar57._16_4_ = 0x40;
      auVar57._20_4_ = 0x40;
      auVar57._24_4_ = 0x40;
      auVar57._28_4_ = 0x40;
      auVar63._8_4_ = 0x60;
      auVar63._0_8_ = 0x6000000060;
      auVar63._12_4_ = 0x60;
      auVar63._16_4_ = 0x60;
      auVar63._20_4_ = 0x60;
      auVar63._24_4_ = 0x60;
      auVar63._28_4_ = 0x60;
      auVar48 = vcmpps_avx(ZEXT1632(auVar55),auVar41,5);
      local_5aa0 = vblendvps_avx(auVar63,auVar57,auVar48);
      auVar52._8_4_ = 0x80;
      auVar52._0_8_ = 0x8000000080;
      auVar52._12_4_ = 0x80;
      auVar52._16_4_ = 0x80;
      auVar52._20_4_ = 0x80;
      auVar52._24_4_ = 0x80;
      auVar52._28_4_ = 0x80;
      auVar58._8_4_ = 0xa0;
      auVar58._0_8_ = 0xa0000000a0;
      auVar58._12_4_ = 0xa0;
      auVar58._16_4_ = 0xa0;
      auVar58._20_4_ = 0xa0;
      auVar58._24_4_ = 0xa0;
      auVar58._28_4_ = 0xa0;
      auVar41 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar48 = vcmpps_avx(ZEXT1632(auVar69),auVar41,5);
      local_5a80 = vblendvps_avx(auVar58,auVar52,auVar48);
      auVar48 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar41);
      auVar46 = vmaxps_avx(auVar46,auVar41);
      local_5a00 = vpmovsxwd_avx2(auVar51);
      local_4680._8_4_ = 0x7f800000;
      local_4680._0_8_ = 0x7f8000007f800000;
      local_4680._12_4_ = 0x7f800000;
      local_4680._16_4_ = 0x7f800000;
      local_4680._20_4_ = 0x7f800000;
      local_4680._24_4_ = 0x7f800000;
      local_4680._28_4_ = 0x7f800000;
      auVar75 = ZEXT3264(local_4680);
      local_5a60 = vblendvps_avx(local_4680,auVar48,local_5a00);
      auVar48._8_4_ = 0xff800000;
      auVar48._0_8_ = 0xff800000ff800000;
      auVar48._12_4_ = 0xff800000;
      auVar48._16_4_ = 0xff800000;
      auVar48._20_4_ = 0xff800000;
      auVar48._24_4_ = 0xff800000;
      auVar48._28_4_ = 0xff800000;
      local_5a40 = vblendvps_avx(auVar48,auVar46,local_5a00);
      auVar61 = vpcmpeqd_avx(local_5a40._0_16_,local_5a40._0_16_);
      local_5ca0 = vpmovsxwd_avx2(auVar51 ^ auVar61);
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar15 = 7;
      }
      else {
        uVar15 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
      }
      pRVar19 = (RayQueryContext *)0x0;
      puVar22 = local_5800;
      local_5810 = 0xfffffffffffffff8;
      pauVar24 = (undefined1 (*) [32])local_4640;
      local_5808 = (bvh->root).ptr;
      local_5a20._16_16_ = mm_lookupmask_ps._0_16_;
      local_5a20._0_16_ = mm_lookupmask_ps._0_16_;
      local_4660 = local_5a60;
      uStack_5ae4 = local_5c40._28_4_;
      uStack_5ac4 = local_5c40._60_4_;
      do {
        pauVar24 = pauVar24 + -1;
        root.ptr = puVar22[-1];
        puVar22 = puVar22 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00699fa2:
          iVar13 = 3;
        }
        else {
          local_5c80 = *pauVar24;
          auVar46 = vcmpps_avx(local_5c80,local_5a40,1);
          if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar46 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar46 >> 0x7f,0) == '\0') &&
                (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar46 >> 0xbf,0) == '\0') &&
              (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar46[0x1f]) {
            iVar13 = 2;
          }
          else {
            uVar16 = vmovmskps_avx(auVar46);
            pRVar19 = (RayQueryContext *)CONCAT44((int)((ulong)pRVar19 >> 0x20),uVar16);
            iVar13 = 0;
            if ((uint)POPCOUNT(uVar16) <= uVar15) {
              for (; pRVar19 != (RayQueryContext *)0x0;
                  pRVar19 = (RayQueryContext *)
                            ((ulong)((long)&pRVar19[-1].args + 7U) & (ulong)pRVar19)) {
                k = 0;
                for (pRVar2 = pRVar19; ((ulong)pRVar2 & 1) == 0;
                    pRVar2 = (RayQueryContext *)((ulong)pRVar2 >> 1 | 0x8000000000000000)) {
                  k = k + 1;
                }
                bVar25 = occluded1(This,bvh,root,k,(Precalculations *)&local_59c0,ray,
                                   (TravRayK<8,_false> *)&local_5c40.field_0,context);
                if (bVar25) {
                  *(undefined4 *)(local_5ca0 + k * 4) = 0xffffffff;
                }
                auVar75 = ZEXT3264(CONCAT428(0x7f800000,
                                             CONCAT424(0x7f800000,
                                                       CONCAT420(0x7f800000,
                                                                 CONCAT416(0x7f800000,
                                                                           CONCAT412(0x7f800000,
                                                                                     CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              }
              auVar46 = _DAT_0205a980 & ~local_5ca0;
              iVar13 = 3;
              pRVar19 = (RayQueryContext *)0x0;
              if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar46 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar46 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar46 >> 0x7f,0) != '\0') ||
                    (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar46 >> 0xbf,0) != '\0') ||
                  (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar46[0x1f] < '\0') {
                auVar46._8_4_ = 0xff800000;
                auVar46._0_8_ = 0xff800000ff800000;
                auVar46._12_4_ = 0xff800000;
                auVar46._16_4_ = 0xff800000;
                auVar46._20_4_ = 0xff800000;
                auVar46._24_4_ = 0xff800000;
                auVar46._28_4_ = 0xff800000;
                local_5a40 = vblendvps_avx(local_5a40,auVar46,local_5ca0);
                iVar13 = 2;
              }
            }
            if (uVar15 < (uint)POPCOUNT(uVar16)) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr != 0xfffffffffffffff8) {
                    auVar46 = vcmpps_avx(local_5a40,local_5c80,6);
                    if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar46 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar46 >> 0x7f,0) == '\0') &&
                          (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar46 >> 0xbf,0) == '\0') &&
                        (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar46[0x1f]) {
                      iVar13 = 2;
                    }
                    else {
                      pRVar19 = (RayQueryContext *)This->leafIntersector;
                      local_5c60 = local_5a20._0_8_;
                      uStack_5c58 = local_5a20._8_8_;
                      uStack_5c50 = local_5a20._16_8_;
                      uStack_5c48 = local_5a20._24_8_;
                      local_5c80 = local_5ca0;
                      uVar20 = vmovmskps_avx(local_5ca0);
                      if ((uVar20 ^ 0xff) != 0) {
                        uVar17 = (ulong)(byte)(uVar20 ^ 0xff);
                        puVar14 = (undefined8 *)
                                  ((long)pRVar19 +
                                  (ulong)*(byte *)(root.ptr & 0xfffffffffffffff0) * 0x40 + 0x28);
                        do {
                          lVar21 = 0;
                          for (uVar23 = uVar17; (uVar23 & 1) == 0;
                              uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                            lVar21 = lVar21 + 1;
                          }
                          pRVar19 = context;
                          cVar12 = (*(code *)*puVar14)(&local_59c0,ray,lVar21,context,
                                                       (byte *)(root.ptr & 0xfffffffffffffff0));
                          if (cVar12 != '\0') {
                            *(undefined4 *)((long)&local_5c60 + lVar21 * 4) = 0xffffffff;
                          }
                          uVar17 = uVar17 - 1 & uVar17;
                        } while (uVar17 != 0);
                      }
                      auVar6._8_8_ = uStack_5c58;
                      auVar6._0_8_ = local_5c60;
                      auVar6._16_8_ = uStack_5c50;
                      auVar6._24_8_ = uStack_5c48;
                      local_5ca0 = vorps_avx(local_5c80,auVar6);
                      auVar46 = _DAT_0205a980 & ~local_5ca0;
                      if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar46 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar46 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar46 >> 0x7f,0) == '\0') &&
                            (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar46 >> 0xbf,0) == '\0') &&
                          (auVar46 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar46[0x1f]) {
                        iVar13 = 3;
                      }
                      else {
                        auVar45._8_4_ = 0xff800000;
                        auVar45._0_8_ = 0xff800000ff800000;
                        auVar45._12_4_ = 0xff800000;
                        auVar45._16_4_ = 0xff800000;
                        auVar45._20_4_ = 0xff800000;
                        auVar45._24_4_ = 0xff800000;
                        auVar45._28_4_ = 0xff800000;
                        local_5a40 = vblendvps_avx(local_5a40,auVar45,local_5ca0);
                        iVar13 = 0;
                      }
                    }
                    auVar75 = ZEXT3264(CONCAT428(0x7f800000,
                                                 CONCAT424(0x7f800000,
                                                           CONCAT420(0x7f800000,
                                                                     CONCAT416(0x7f800000,
                                                                               CONCAT412(0x7f800000,
                                                                                         CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    break;
                  }
                  goto LAB_00699fa2;
                }
                uVar18 = root.ptr & 0xfffffffffffffff0;
                auVar83 = ZEXT3264(auVar75._0_32_);
                uVar17 = 0;
                uVar23 = 8;
                do {
                  uVar1 = *(ulong *)(uVar18 + uVar17 * 8);
                  if (uVar1 != 8) {
                    if ((root.ptr & 7) == 0) {
                      uVar16 = *(undefined4 *)(root.ptr + 0x40 + uVar17 * 4);
                      auVar27._4_4_ = uVar16;
                      auVar27._0_4_ = uVar16;
                      auVar27._8_4_ = uVar16;
                      auVar27._12_4_ = uVar16;
                      auVar27._16_4_ = uVar16;
                      auVar27._20_4_ = uVar16;
                      auVar27._24_4_ = uVar16;
                      auVar27._28_4_ = uVar16;
                      auVar9._4_4_ = fStack_5b1c;
                      auVar9._0_4_ = local_5b20;
                      auVar9._8_4_ = fStack_5b18;
                      auVar9._12_4_ = fStack_5b14;
                      auVar9._16_4_ = fStack_5b10;
                      auVar9._20_4_ = fStack_5b0c;
                      auVar9._24_4_ = fStack_5b08;
                      auVar9._28_4_ = uStack_5b04;
                      uVar16 = *(undefined4 *)(root.ptr + 0x80 + uVar17 * 4);
                      auVar34._4_4_ = uVar16;
                      auVar34._0_4_ = uVar16;
                      auVar34._8_4_ = uVar16;
                      auVar34._12_4_ = uVar16;
                      auVar34._16_4_ = uVar16;
                      auVar34._20_4_ = uVar16;
                      auVar34._24_4_ = uVar16;
                      auVar34._28_4_ = uVar16;
                      auVar51 = vfmsub213ps_fma(auVar27,local_5b80,auVar9);
                      auVar28 = ZEXT1632(auVar51);
                      auVar10._4_4_ = fStack_5afc;
                      auVar10._0_4_ = local_5b00;
                      auVar10._8_4_ = fStack_5af8;
                      auVar10._12_4_ = fStack_5af4;
                      auVar10._16_4_ = fStack_5af0;
                      auVar10._20_4_ = fStack_5aec;
                      auVar10._24_4_ = fStack_5ae8;
                      auVar10._28_4_ = uStack_5ae4;
                      uVar16 = *(undefined4 *)(root.ptr + 0xc0 + uVar17 * 4);
                      auVar42._4_4_ = uVar16;
                      auVar42._0_4_ = uVar16;
                      auVar42._8_4_ = uVar16;
                      auVar42._12_4_ = uVar16;
                      auVar42._16_4_ = uVar16;
                      auVar42._20_4_ = uVar16;
                      auVar42._24_4_ = uVar16;
                      auVar42._28_4_ = uVar16;
                      auVar51 = vfmsub213ps_fma(auVar34,local_5b60,auVar10);
                      auVar35 = ZEXT1632(auVar51);
                      auVar11._4_4_ = fStack_5adc;
                      auVar11._0_4_ = local_5ae0;
                      auVar11._8_4_ = fStack_5ad8;
                      auVar11._12_4_ = fStack_5ad4;
                      auVar11._16_4_ = fStack_5ad0;
                      auVar11._20_4_ = fStack_5acc;
                      auVar11._24_4_ = fStack_5ac8;
                      auVar11._28_4_ = uStack_5ac4;
                      uVar16 = *(undefined4 *)(root.ptr + 0x60 + uVar17 * 4);
                      auVar49._4_4_ = uVar16;
                      auVar49._0_4_ = uVar16;
                      auVar49._8_4_ = uVar16;
                      auVar49._12_4_ = uVar16;
                      auVar49._16_4_ = uVar16;
                      auVar49._20_4_ = uVar16;
                      auVar49._24_4_ = uVar16;
                      auVar49._28_4_ = uVar16;
                      auVar51 = vfmsub213ps_fma(auVar42,local_5b40,auVar11);
                      auVar43 = ZEXT1632(auVar51);
                      auVar47 = vfmsub213ps_fma(auVar49,local_5b80,auVar9);
                      uVar16 = *(undefined4 *)(root.ptr + 0xa0 + uVar17 * 4);
                      auVar53._4_4_ = uVar16;
                      auVar53._0_4_ = uVar16;
                      auVar53._8_4_ = uVar16;
                      auVar53._12_4_ = uVar16;
                      auVar53._16_4_ = uVar16;
                      auVar53._20_4_ = uVar16;
                      auVar53._24_4_ = uVar16;
                      auVar53._28_4_ = uVar16;
                      auVar51 = vfmsub213ps_fma(auVar53,local_5b60,auVar10);
                      uVar16 = *(undefined4 *)(root.ptr + 0xe0 + uVar17 * 4);
                      auVar59._4_4_ = uVar16;
                      auVar59._0_4_ = uVar16;
                      auVar59._8_4_ = uVar16;
                      auVar59._12_4_ = uVar16;
                      auVar59._16_4_ = uVar16;
                      auVar59._20_4_ = uVar16;
                      auVar59._24_4_ = uVar16;
                      auVar59._28_4_ = uVar16;
                      auVar56 = vfmsub213ps_fma(auVar59,local_5b40,auVar11);
                    }
                    else {
                      uVar16 = *(undefined4 *)(uVar18 + 0x40 + uVar17 * 4);
                      auVar54._4_4_ = uVar16;
                      auVar54._0_4_ = uVar16;
                      auVar54._8_4_ = uVar16;
                      auVar54._12_4_ = uVar16;
                      auVar54._16_4_ = uVar16;
                      auVar54._20_4_ = uVar16;
                      auVar54._24_4_ = uVar16;
                      auVar54._28_4_ = uVar16;
                      uVar16 = *(undefined4 *)(uVar18 + 0x60 + uVar17 * 4);
                      auVar36._4_4_ = uVar16;
                      auVar36._0_4_ = uVar16;
                      auVar36._8_4_ = uVar16;
                      auVar36._12_4_ = uVar16;
                      auVar36._16_4_ = uVar16;
                      auVar36._20_4_ = uVar16;
                      auVar36._24_4_ = uVar16;
                      auVar36._28_4_ = uVar16;
                      uVar16 = *(undefined4 *)(uVar18 + 0x80 + uVar17 * 4);
                      auVar82._4_4_ = uVar16;
                      auVar82._0_4_ = uVar16;
                      auVar82._8_4_ = uVar16;
                      auVar82._12_4_ = uVar16;
                      auVar82._16_4_ = uVar16;
                      auVar82._20_4_ = uVar16;
                      auVar82._24_4_ = uVar16;
                      auVar82._28_4_ = uVar16;
                      uVar16 = *(undefined4 *)(uVar18 + 0xa0 + uVar17 * 4);
                      auVar67._4_4_ = uVar16;
                      auVar67._0_4_ = uVar16;
                      auVar67._8_4_ = uVar16;
                      auVar67._12_4_ = uVar16;
                      auVar67._16_4_ = uVar16;
                      auVar67._20_4_ = uVar16;
                      auVar67._24_4_ = uVar16;
                      auVar67._28_4_ = uVar16;
                      uVar16 = *(undefined4 *)(uVar18 + 0xc0 + uVar17 * 4);
                      auVar66._4_4_ = uVar16;
                      auVar66._0_4_ = uVar16;
                      auVar66._8_4_ = uVar16;
                      auVar66._12_4_ = uVar16;
                      auVar66._16_4_ = uVar16;
                      auVar66._20_4_ = uVar16;
                      auVar66._24_4_ = uVar16;
                      auVar66._28_4_ = uVar16;
                      uVar16 = *(undefined4 *)(uVar18 + 0xe0 + uVar17 * 4);
                      auVar64._4_4_ = uVar16;
                      auVar64._0_4_ = uVar16;
                      auVar64._8_4_ = uVar16;
                      auVar64._12_4_ = uVar16;
                      auVar64._16_4_ = uVar16;
                      auVar64._20_4_ = uVar16;
                      auVar64._24_4_ = uVar16;
                      auVar64._28_4_ = uVar16;
                      fVar26 = *(float *)(uVar18 + 0x100 + uVar17 * 4);
                      auVar70._4_4_ = fVar26;
                      auVar70._0_4_ = fVar26;
                      auVar70._8_4_ = fVar26;
                      auVar70._12_4_ = fVar26;
                      auVar70._16_4_ = fVar26;
                      auVar70._20_4_ = fVar26;
                      auVar70._24_4_ = fVar26;
                      auVar70._28_4_ = fVar26;
                      fVar30 = *(float *)(uVar18 + 0x120 + uVar17 * 4);
                      auVar74._4_4_ = fVar30;
                      auVar74._0_4_ = fVar30;
                      auVar74._8_4_ = fVar30;
                      auVar74._12_4_ = fVar30;
                      auVar74._16_4_ = fVar30;
                      auVar74._20_4_ = fVar30;
                      auVar74._24_4_ = fVar30;
                      auVar74._28_4_ = fVar30;
                      fVar31 = *(float *)(uVar18 + 0x140 + uVar17 * 4);
                      auVar78._4_4_ = fVar31;
                      auVar78._0_4_ = fVar31;
                      auVar78._8_4_ = fVar31;
                      auVar78._12_4_ = fVar31;
                      auVar78._16_4_ = fVar31;
                      auVar78._20_4_ = fVar31;
                      auVar78._24_4_ = fVar31;
                      auVar78._28_4_ = fVar31;
                      uVar16 = *(undefined4 *)(uVar18 + 0x160 + uVar17 * 4);
                      auVar60._4_4_ = uVar16;
                      auVar60._0_4_ = uVar16;
                      auVar60._8_4_ = uVar16;
                      auVar60._12_4_ = uVar16;
                      auVar60._16_4_ = uVar16;
                      auVar60._20_4_ = uVar16;
                      auVar60._24_4_ = uVar16;
                      auVar60._28_4_ = uVar16;
                      uVar16 = *(undefined4 *)(uVar18 + 0x180 + uVar17 * 4);
                      auVar50._4_4_ = uVar16;
                      auVar50._0_4_ = uVar16;
                      auVar50._8_4_ = uVar16;
                      auVar50._12_4_ = uVar16;
                      auVar50._16_4_ = uVar16;
                      auVar50._20_4_ = uVar16;
                      auVar50._24_4_ = uVar16;
                      auVar50._28_4_ = uVar16;
                      uVar16 = *(undefined4 *)(uVar18 + 0x1a0 + uVar17 * 4);
                      auVar44._4_4_ = uVar16;
                      auVar44._0_4_ = uVar16;
                      auVar44._8_4_ = uVar16;
                      auVar44._12_4_ = uVar16;
                      auVar44._16_4_ = uVar16;
                      auVar44._20_4_ = uVar16;
                      auVar44._24_4_ = uVar16;
                      auVar44._28_4_ = uVar16;
                      auVar51 = vfmadd231ps_fma(auVar60,(undefined1  [32])
                                                        local_5c40.field_0.z.field_0,auVar70);
                      auVar61 = vfmadd231ps_fma(auVar50,(undefined1  [32])
                                                        local_5c40.field_0.z.field_0,auVar74);
                      auVar55 = vfmadd231ps_fma(auVar44,(undefined1  [32])
                                                        local_5c40.field_0.z.field_0,auVar78);
                      auVar3._4_4_ = fVar26 * (float)local_5ba0._4_4_;
                      auVar3._0_4_ = fVar26 * (float)local_5ba0._0_4_;
                      auVar3._8_4_ = fVar26 * fStack_5b98;
                      auVar3._12_4_ = fVar26 * fStack_5b94;
                      auVar3._16_4_ = fVar26 * fStack_5b90;
                      auVar3._20_4_ = fVar26 * fStack_5b8c;
                      auVar3._24_4_ = fVar26 * fStack_5b88;
                      auVar3._28_4_ = fVar26;
                      auVar4._4_4_ = fVar30 * (float)local_5ba0._4_4_;
                      auVar4._0_4_ = fVar30 * (float)local_5ba0._0_4_;
                      auVar4._8_4_ = fVar30 * fStack_5b98;
                      auVar4._12_4_ = fVar30 * fStack_5b94;
                      auVar4._16_4_ = fVar30 * fStack_5b90;
                      auVar4._20_4_ = fVar30 * fStack_5b8c;
                      auVar4._24_4_ = fVar30 * fStack_5b88;
                      auVar4._28_4_ = fVar30;
                      auVar5._4_4_ = fVar31 * (float)local_5ba0._4_4_;
                      auVar5._0_4_ = fVar31 * (float)local_5ba0._0_4_;
                      auVar5._8_4_ = fVar31 * fStack_5b98;
                      auVar5._12_4_ = fVar31 * fStack_5b94;
                      auVar5._16_4_ = fVar31 * fStack_5b90;
                      auVar5._20_4_ = fVar31 * fStack_5b8c;
                      auVar5._24_4_ = fVar31 * fStack_5b88;
                      auVar5._28_4_ = fVar31;
                      auVar69 = vfmadd231ps_fma(auVar3,local_5bc0,auVar67);
                      auVar79 = vfmadd231ps_fma(auVar4,local_5bc0,auVar66);
                      auVar76 = vfmadd231ps_fma(auVar5,auVar64,local_5bc0);
                      auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),local_5be0,auVar54);
                      auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),local_5be0,auVar36);
                      auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar82,local_5be0);
                      auVar46 = vandps_avx(ZEXT1632(auVar69),local_59e0);
                      auVar29._8_4_ = 0x219392ef;
                      auVar29._0_8_ = 0x219392ef219392ef;
                      auVar29._12_4_ = 0x219392ef;
                      auVar29._16_4_ = 0x219392ef;
                      auVar29._20_4_ = 0x219392ef;
                      auVar29._24_4_ = 0x219392ef;
                      auVar29._28_4_ = 0x219392ef;
                      auVar46 = vcmpps_avx(auVar46,auVar29,1);
                      auVar48 = vblendvps_avx(ZEXT1632(auVar69),auVar29,auVar46);
                      auVar46 = vandps_avx(ZEXT1632(auVar79),local_59e0);
                      auVar46 = vcmpps_avx(auVar46,auVar29,1);
                      auVar41 = vblendvps_avx(ZEXT1632(auVar79),auVar29,auVar46);
                      auVar46 = vandps_avx(ZEXT1632(auVar76),local_59e0);
                      auVar46 = vcmpps_avx(auVar46,auVar29,1);
                      auVar46 = vblendvps_avx(ZEXT1632(auVar76),auVar29,auVar46);
                      auVar8._4_4_ = local_5c40._36_4_;
                      auVar8._0_4_ = local_5c40._32_4_;
                      auVar8._8_4_ = local_5c40._40_4_;
                      auVar8._12_4_ = local_5c40._44_4_;
                      auVar8._16_4_ = local_5c40._48_4_;
                      auVar8._20_4_ = local_5c40._52_4_;
                      auVar8._24_4_ = local_5c40._56_4_;
                      auVar8._28_4_ = local_5c40._60_4_;
                      auVar69 = vfmadd231ps_fma(ZEXT1632(auVar51),auVar8,auVar67);
                      auVar79 = vfmadd231ps_fma(ZEXT1632(auVar61),auVar8,auVar66);
                      auVar65 = vrcpps_avx(auVar48);
                      auVar76 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar8,auVar64);
                      auVar52 = vrcpps_avx(auVar41);
                      auVar68._8_4_ = 0x3f800000;
                      auVar68._0_8_ = &DAT_3f8000003f800000;
                      auVar68._12_4_ = 0x3f800000;
                      auVar68._16_4_ = 0x3f800000;
                      auVar68._20_4_ = 0x3f800000;
                      auVar68._24_4_ = 0x3f800000;
                      auVar68._28_4_ = 0x3f800000;
                      auVar51 = vfnmadd213ps_fma(auVar48,auVar65,auVar68);
                      auVar51 = vfmadd132ps_fma(ZEXT1632(auVar51),auVar65,auVar65);
                      auVar61 = vfnmadd213ps_fma(auVar41,auVar52,auVar68);
                      auVar61 = vfmadd132ps_fma(ZEXT1632(auVar61),auVar52,auVar52);
                      auVar48 = vrcpps_avx(auVar46);
                      auVar55 = vfnmadd213ps_fma(auVar46,auVar48,auVar68);
                      auVar55 = vfmadd132ps_fma(ZEXT1632(auVar55),auVar48,auVar48);
                      auVar7._4_4_ = local_5c40._4_4_;
                      auVar7._0_4_ = local_5c40._0_4_;
                      auVar7._8_4_ = local_5c40._8_4_;
                      auVar7._12_4_ = local_5c40._12_4_;
                      auVar7._16_4_ = local_5c40._16_4_;
                      auVar7._20_4_ = local_5c40._20_4_;
                      auVar7._24_4_ = local_5c40._24_4_;
                      auVar7._28_4_ = local_5c40._28_4_;
                      auVar69 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar7,auVar54);
                      auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar7,auVar36);
                      auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar7,auVar82);
                      fVar26 = auVar69._0_4_ * -auVar51._0_4_;
                      fVar30 = auVar69._4_4_ * -auVar51._4_4_;
                      auVar28._4_4_ = fVar30;
                      auVar28._0_4_ = fVar26;
                      fVar31 = auVar69._8_4_ * -auVar51._8_4_;
                      auVar28._8_4_ = fVar31;
                      fVar32 = auVar69._12_4_ * -auVar51._12_4_;
                      auVar28._12_4_ = fVar32;
                      auVar28._16_4_ = 0x80000000;
                      auVar28._20_4_ = 0x80000000;
                      auVar28._24_4_ = 0x80000000;
                      auVar28._28_4_ = 0x80000000;
                      fVar33 = auVar79._0_4_ * -auVar61._0_4_;
                      fVar38 = auVar79._4_4_ * -auVar61._4_4_;
                      auVar35._4_4_ = fVar38;
                      auVar35._0_4_ = fVar33;
                      fVar39 = auVar79._8_4_ * -auVar61._8_4_;
                      auVar35._8_4_ = fVar39;
                      fVar40 = auVar79._12_4_ * -auVar61._12_4_;
                      auVar35._12_4_ = fVar40;
                      auVar35._16_4_ = 0x80000000;
                      auVar35._20_4_ = 0x80000000;
                      auVar35._24_4_ = 0x80000000;
                      auVar35._28_4_ = 0x80000000;
                      auVar43._0_4_ = auVar76._0_4_ * -auVar55._0_4_;
                      auVar43._4_4_ = auVar76._4_4_ * -auVar55._4_4_;
                      auVar43._8_4_ = auVar76._8_4_ * -auVar55._8_4_;
                      auVar43._12_4_ = auVar76._12_4_ * -auVar55._12_4_;
                      auVar43._16_4_ = 0x80000000;
                      auVar43._20_4_ = 0x80000000;
                      auVar43._24_4_ = 0x80000000;
                      auVar43._28_4_ = 0;
                      auVar47._0_4_ = auVar51._0_4_ + fVar26;
                      auVar47._4_4_ = auVar51._4_4_ + fVar30;
                      auVar47._8_4_ = auVar51._8_4_ + fVar31;
                      auVar47._12_4_ = auVar51._12_4_ + fVar32;
                      auVar51._0_4_ = auVar61._0_4_ + fVar33;
                      auVar51._4_4_ = auVar61._4_4_ + fVar38;
                      auVar51._8_4_ = auVar61._8_4_ + fVar39;
                      auVar51._12_4_ = auVar61._12_4_ + fVar40;
                      auVar75 = ZEXT3264(CONCAT428(0x7f800000,
                                                   CONCAT424(0x7f800000,
                                                             CONCAT420(0x7f800000,
                                                                       CONCAT416(0x7f800000,
                                                                                 CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                      auVar56._0_4_ = auVar55._0_4_ + auVar43._0_4_;
                      auVar56._4_4_ = auVar55._4_4_ + auVar43._4_4_;
                      auVar56._8_4_ = auVar55._8_4_ + auVar43._8_4_;
                      auVar56._12_4_ = auVar55._12_4_ + auVar43._12_4_;
                    }
                    auVar46 = vpminsd_avx2(auVar28,ZEXT1632(auVar47));
                    auVar48 = vpminsd_avx2(auVar35,ZEXT1632(auVar51));
                    auVar46 = vpmaxsd_avx2(auVar46,auVar48);
                    auVar48 = vpminsd_avx2(auVar43,ZEXT1632(auVar56));
                    auVar48 = vpmaxsd_avx2(auVar46,auVar48);
                    auVar46 = vpmaxsd_avx2(auVar28,ZEXT1632(auVar47));
                    auVar41 = vpmaxsd_avx2(auVar35,ZEXT1632(auVar51));
                    auVar41 = vpminsd_avx2(auVar46,auVar41);
                    auVar46 = vpmaxsd_avx2(auVar43,ZEXT1632(auVar56));
                    auVar41 = vpminsd_avx2(auVar41,auVar46);
                    auVar46 = vpmaxsd_avx2(auVar48,local_5a60);
                    auVar41 = vpminsd_avx2(auVar41,local_5a40);
                    auVar46 = vcmpps_avx(auVar46,auVar41,2);
                    if ((((((((auVar46 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar46 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar46 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar46 >> 0x7f,0) != '\0') ||
                          (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar46 >> 0xbf,0) != '\0') ||
                        (auVar46 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar46[0x1f] < '\0') {
                      auVar46 = vblendvps_avx(auVar75._0_32_,auVar48,auVar46);
                      if (uVar23 != 8) {
                        *puVar22 = uVar23;
                        puVar22 = puVar22 + 1;
                        *pauVar24 = auVar83._0_32_;
                        pauVar24 = pauVar24 + 1;
                      }
                      auVar83 = ZEXT3264(auVar46);
                      uVar23 = uVar1;
                    }
                  }
                  local_5c80 = auVar83._0_32_;
                } while ((uVar1 != 8) && (bVar25 = uVar17 < 7, uVar17 = uVar17 + 1, bVar25));
                iVar13 = 0;
                if (uVar23 == 8) {
LAB_00699e69:
                  pRVar19 = (RayQueryContext *)0x0;
                  iVar13 = 4;
                }
                else {
                  auVar46 = vcmpps_avx(local_5a40,local_5c80,6);
                  uVar16 = vmovmskps_avx(auVar46);
                  pRVar19 = (RayQueryContext *)
                            CONCAT71((int7)(CONCAT44((int)(uVar18 >> 0x20),uVar16) >> 8),1);
                  if ((uint)POPCOUNT(uVar16) <= uVar15) {
                    *puVar22 = uVar23;
                    puVar22 = puVar22 + 1;
                    *pauVar24 = local_5c80;
                    pauVar24 = pauVar24 + 1;
                    goto LAB_00699e69;
                  }
                }
                root.ptr = uVar23;
              } while ((char)pRVar19 != '\0');
            }
          }
        }
      } while (iVar13 != 3);
      auVar46 = vandps_avx(local_5a00,local_5ca0);
      auVar37._8_4_ = 0xff800000;
      auVar37._0_8_ = 0xff800000ff800000;
      auVar37._12_4_ = 0xff800000;
      auVar37._16_4_ = 0xff800000;
      auVar37._20_4_ = 0xff800000;
      auVar37._24_4_ = 0xff800000;
      auVar37._28_4_ = 0xff800000;
      auVar46 = vmaskmovps_avx(auVar46,auVar37);
      *(undefined1 (*) [32])(ray + 0x100) = auVar46;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }